

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O3

void __thiscall
FSoftwareRenderer::Precache
          (FSoftwareRenderer *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  ushort uVar1;
  Node *pNVar2;
  bool bVar3;
  Node *pNVar4;
  uint uVar5;
  spriteframe_t *psVar6;
  FSoftwareRenderer *this_00;
  IPair *pIVar7;
  ulong uVar8;
  uint uVar9;
  int32_t *piVar10;
  FTexture *tex;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  
  uVar5 = sprites.Count;
  uVar15 = (ulong)sprites.Count;
  this_00 = (FSoftwareRenderer *)operator_new__(uVar15);
  uVar8 = 0;
  memset(this_00,0,uVar15);
  uVar9 = actorhitlist->Size;
  if ((ulong)uVar9 != 0) {
    pNVar2 = actorhitlist->Nodes;
    do {
      uVar8 = uVar8 & 0xffffffff;
      pNVar4 = pNVar2 + uVar8;
      while (pIVar7 = &pNVar4->Pair, *(long *)((long)(pIVar7 + -1) + 8) == 1) {
        uVar8 = uVar8 + 1;
        pNVar4 = (Node *)(pIVar7 + 1);
        if (uVar9 <= uVar8) goto LAB_002cb6ad;
      }
      uVar15 = (ulong)pIVar7->Key->NumOwnedStates;
      if (0 < (long)uVar15) {
        piVar10 = &pIVar7->Key->OwnedStates->sprite;
        uVar11 = 0;
        do {
          *(undefined1 *)((long)&(this_00->super_FRenderer)._vptr_FRenderer + (long)*piVar10) = 1;
          uVar11 = uVar11 + 1;
          piVar10 = piVar10 + 10;
        } while (uVar11 < uVar15);
      }
      uVar8 = uVar8 + 1;
    } while ((uint)uVar8 < uVar9);
  }
LAB_002cb6ad:
  if (-1 < (int)(uVar5 - 1)) {
    uVar8 = (ulong)(uVar5 - 1);
    do {
      if ((*(char *)((long)&(this_00->super_FRenderer)._vptr_FRenderer + uVar8) != '\0') &&
         (sprites.Array[uVar8].numframes != '\0')) {
        uVar9 = 0;
        lVar12 = 8;
        do {
          psVar6 = SpriteFrames.Array;
          uVar1 = sprites.Array[uVar8].spriteframes;
          lVar13 = 0;
          do {
            lVar14 = (long)*(int *)((long)&psVar6->Texture[lVar13 + -2].texnum +
                                   (ulong)((uint)uVar1 * 0x50) + lVar12);
            if (0 < lVar14) {
              texhitlist[lVar14] = '\b';
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x10);
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + 0x50;
        } while (uVar9 < sprites.Array[uVar8].numframes);
      }
      bVar3 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar3);
  }
  operator_delete__(this_00);
  uVar8 = (ulong)(int)TexMan.Textures.Count;
  if (0 < (long)uVar8) {
    lVar12 = uVar8 << 4;
    do {
      uVar15 = uVar8 - 1;
      if (uVar15 < TexMan.Textures.Count) {
        tex = *(FTexture **)((long)&TexMan.Textures.Array[-1].Texture + lVar12);
      }
      else {
        tex = (FTexture *)0x0;
      }
      PrecacheTexture(this_00,tex,(uint)texhitlist[uVar15]);
      bVar3 = 1 < uVar8;
      lVar12 = lVar12 + -0x10;
      uVar8 = uVar15;
    } while (bVar3);
  }
  return;
}

Assistant:

void FSoftwareRenderer::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	BYTE *spritelist = new BYTE[sprites.Size()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;

	memset(spritelist, 0, sprites.Size());

	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite] = true;
		}
	}

	// Precache textures (and sprites).

	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i])
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						texhitlist[pic.GetIndex()] = FTextureManager::HIT_Sprite;
					}
				}
			}
		}
	}
	delete[] spritelist;

	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		PrecacheTexture(TexMan.ByIndex(i), texhitlist[i]);
	}
}